

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O3

void ZopfliLZ77Greedy(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,
                     ZopfliLZ77Store *store,ZopfliHash *h)

{
  bool bVar1;
  unsigned_short length;
  int iVar2;
  long lVar3;
  uint uVar5;
  ulong uVar6;
  unsigned_short leng;
  uint local_25c;
  uint local_258;
  unsigned_short dist;
  ZopfliLZ77Store *local_250;
  uint local_244;
  ZopfliBlockState *local_240;
  unsigned_short dummysublen [259];
  size_t sVar4;
  
  if (instart != inend) {
    uVar6 = 0;
    if (0x7fff < instart) {
      uVar6 = instart - 0x8000;
    }
    local_250 = store;
    local_240 = s;
    ZopfliResetHash(0x8000,h);
    ZopfliWarmupHash(in,uVar6,inend,h);
    if (uVar6 < instart) {
      sVar4 = 0x8000;
      if (instart < 0x8000) {
        sVar4 = instart;
      }
      lVar3 = -sVar4;
      do {
        ZopfliUpdateHash(in,instart + lVar3,inend,h);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
    }
    if (instart < inend) {
      bVar1 = false;
      local_25c = 0;
      local_258 = 0;
      do {
        ZopfliUpdateHash(in,instart,inend,h);
        ZopfliFindLongestMatch(local_240,h,in,instart,inend,0x102,dummysublen,&dist,&leng);
        length = leng;
        uVar6 = (ulong)leng;
        iVar2 = (leng - 1) + (uint)(dist < 0x401);
        uVar5 = (uint)dist;
        if (bVar1) {
          if ((int)((local_258 - (0x400 < (int)local_25c)) + 1) < iVar2) {
            local_244 = (uint)dist;
            ZopfliStoreLitLenDist((ushort)in[instart - 1],0,instart - 1,local_250);
            uVar5 = local_244;
            goto LAB_0012534a;
          }
          leng = (unsigned_short)local_258;
          dist = (unsigned_short)local_25c;
          uVar5 = local_258 & 0xffff;
          ZopfliStoreLitLenDist(leng,dist,instart - 1,local_250);
          if (2 < uVar5) {
            lVar3 = (ulong)uVar5 - 2;
            do {
              instart = instart + 1;
              ZopfliUpdateHash(in,instart,inend,h);
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
          }
LAB_0012543d:
          bVar1 = false;
        }
        else {
LAB_0012534a:
          bVar1 = true;
          if (iVar2 < 3 || 0x101 < length) {
            if (iVar2 < 3) {
              leng = 1;
              ZopfliStoreLitLenDist((ushort)in[instart],0,instart,local_250);
            }
            else {
              ZopfliStoreLitLenDist(length,(unsigned_short)uVar5,instart,local_250);
              if (1 < length) {
                lVar3 = uVar6 - 1;
                do {
                  instart = instart + 1;
                  ZopfliUpdateHash(in,instart,inend,h);
                  lVar3 = lVar3 + -1;
                } while (lVar3 != 0);
              }
            }
            goto LAB_0012543d;
          }
          local_258 = (uint)length;
          local_25c = uVar5;
        }
        instart = instart + 1;
      } while (instart < inend);
    }
  }
  return;
}

Assistant:

void ZopfliLZ77Greedy(ZopfliBlockState* s, const unsigned char* in,
                      size_t instart, size_t inend,
                      ZopfliLZ77Store* store, ZopfliHash* h) {
  size_t i = 0, j;
  unsigned short leng;
  unsigned short dist;
  int lengthscore;
  size_t windowstart = instart > ZOPFLI_WINDOW_SIZE
      ? instart - ZOPFLI_WINDOW_SIZE : 0;
  unsigned short dummysublen[259];

#ifdef ZOPFLI_LAZY_MATCHING
  /* Lazy matching. */
  unsigned prev_length = 0;
  unsigned prev_match = 0;
  int prevlengthscore;
  int match_available = 0;
#endif

  if (instart == inend) return;

  ZopfliResetHash(ZOPFLI_WINDOW_SIZE, h);
  ZopfliWarmupHash(in, windowstart, inend, h);
  for (i = windowstart; i < instart; i++) {
    ZopfliUpdateHash(in, i, inend, h);
  }

  for (i = instart; i < inend; i++) {
    ZopfliUpdateHash(in, i, inend, h);

    ZopfliFindLongestMatch(s, h, in, i, inend, ZOPFLI_MAX_MATCH, dummysublen,
                           &dist, &leng);
    lengthscore = GetLengthScore(leng, dist);

#ifdef ZOPFLI_LAZY_MATCHING
    /* Lazy matching. */
    prevlengthscore = GetLengthScore(prev_length, prev_match);
    if (match_available) {
      match_available = 0;
      if (lengthscore > prevlengthscore + 1) {
        ZopfliStoreLitLenDist(in[i - 1], 0, i - 1, store);
        if (lengthscore >= ZOPFLI_MIN_MATCH && leng < ZOPFLI_MAX_MATCH) {
          match_available = 1;
          prev_length = leng;
          prev_match = dist;
          continue;
        }
      } else {
        /* Add previous to output. */
        leng = prev_length;
        dist = prev_match;
        lengthscore = prevlengthscore;
        /* Add to output. */
        ZopfliVerifyLenDist(in, inend, i - 1, dist, leng);
        ZopfliStoreLitLenDist(leng, dist, i - 1, store);
        for (j = 2; j < leng; j++) {
          assert(i < inend);
          i++;
          ZopfliUpdateHash(in, i, inend, h);
        }
        continue;
      }
    }
    else if (lengthscore >= ZOPFLI_MIN_MATCH && leng < ZOPFLI_MAX_MATCH) {
      match_available = 1;
      prev_length = leng;
      prev_match = dist;
      continue;
    }
    /* End of lazy matching. */
#endif

    /* Add to output. */
    if (lengthscore >= ZOPFLI_MIN_MATCH) {
      ZopfliVerifyLenDist(in, inend, i, dist, leng);
      ZopfliStoreLitLenDist(leng, dist, i, store);
    } else {
      leng = 1;
      ZopfliStoreLitLenDist(in[i], 0, i, store);
    }
    for (j = 1; j < leng; j++) {
      assert(i < inend);
      i++;
      ZopfliUpdateHash(in, i, inend, h);
    }
  }
}